

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportInstallFileGenerator.cxx
# Opt level: O1

string * __thiscall
cmExportInstallFileGenerator::GetFileSetDirectories_abi_cxx11_
          (string *__return_storage_ptr__,cmExportInstallFileGenerator *this,cmGeneratorTarget *gte,
          cmFileSet *fileSet,cmTargetExport *te)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  size_type sVar3;
  cmMakefile *this_00;
  bool bVar4;
  cmFileSet *pcVar5;
  int iVar6;
  mapped_type *ppcVar7;
  string *psVar8;
  ostream *poVar9;
  size_type __rlen;
  WrapQuotes wrapQuotes;
  pointer config;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_00;
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views_01;
  string_view str;
  string_view separator;
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_> cge
  ;
  string dest;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  resultVector;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  configs;
  cmGeneratorExpression ge;
  ostringstream e;
  undefined1 local_2f0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2d8 [2];
  cmFileSet *local_2b8;
  cmGeneratorTarget *local_2b0;
  string local_2a8;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_288;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_270;
  string local_258;
  cmConstStack<cmListFileContext,_cmListFileBacktrace> local_238;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_220;
  cmExportInstallFileGenerator *local_218;
  string *local_210;
  string local_208;
  undefined1 local_1d8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  long local_1b8 [2];
  undefined1 local_1a8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_190;
  undefined8 local_188;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_178;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_170;
  undefined8 local_168;
  char *local_160;
  ios_base local_138 [264];
  
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_288.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_2b8 = fileSet;
  local_2b0 = gte;
  local_218 = this;
  cmMakefile::GetGeneratorConfigs_abi_cxx11_(&local_270,gte->Makefile,IncludeEmptyConfig);
  local_238.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_ptr = (element_type *)0x0;
  local_238.TopEntry.
  super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
  ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cmConstStack<cmListFileContext,_cmListFileBacktrace>::cmConstStack(&local_238);
  cmGeneratorExpression::cmGeneratorExpression
            ((cmGeneratorExpression *)local_1d8,(cmListFileBacktrace *)&local_238);
  if (local_238.TopEntry.
      super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_238.TopEntry.
               super___shared_ptr<const_cmConstStack<cmListFileContext,_cmListFileBacktrace>::Entry,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  ppcVar7 = std::
            map<cmFileSet_*,_cmInstallFileSetGenerator_*,_std::less<cmFileSet_*>,_std::allocator<std::pair<cmFileSet_*const,_cmInstallFileSetGenerator_*>_>_>
            ::at(&te->FileSetGenerators,&local_2b8);
  pcVar2 = ((*ppcVar7)->super_cmInstallGenerator).Destination._M_dataplus._M_p;
  local_1c8._M_allocated_capacity = (size_type)local_1b8;
  std::__cxx11::string::_M_construct<char*>
            ((string *)(local_1d8 + 0x10),pcVar2,
             pcVar2 + ((*ppcVar7)->super_cmInstallGenerator).Destination._M_string_length);
  cmGeneratorExpression::Parse((cmGeneratorExpression *)local_2f0,(string *)local_1d8);
  if ((long *)local_1c8._M_allocated_capacity != local_1b8) {
    operator_delete((void *)local_1c8._M_allocated_capacity,local_1b8[0] + 1);
  }
  local_210 = local_270.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  if (local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      local_270.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    paVar1 = &local_208.field_2;
    local_220 = &__return_storage_ptr__->field_2;
    config = local_270.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    do {
      local_208._M_string_length = 0;
      local_208.field_2._M_local_buf[0] = '\0';
      wrapQuotes = Wrap;
      local_208._M_dataplus._M_p = (pointer)paVar1;
      psVar8 = cmCompiledGeneratorExpression::Evaluate
                         ((cmCompiledGeneratorExpression *)local_2f0._0_8_,local_2b0->LocalGenerator
                          ,config,local_2b0,(cmGeneratorExpressionDAGChecker *)0x0,
                          (cmGeneratorTarget *)0x0,&local_208);
      str._M_str = &DAT_00000001;
      str._M_len = (size_t)(psVar8->_M_dataplus)._M_p;
      cmOutputConverter::EscapeForCMake_abi_cxx11_
                ((string *)(local_2f0 + 8),(cmOutputConverter *)psVar8->_M_string_length,str,
                 wrapQuotes);
      local_1a8._0_8_ = (_func_int **)0x12;
      local_1a8._8_8_ = "${_IMPORT_PREFIX}/";
      local_198 = local_2e0;
      local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_2f0._8_8_;
      views._M_len = 2;
      views._M_array = (iterator)local_1a8;
      cmCatViews_abi_cxx11_(&local_2a8,views);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2f0._8_8_ != local_2d8) {
        operator_delete((void *)local_2f0._8_8_,
                        CONCAT71(local_2d8[0]._M_allocated_capacity._1_7_,
                                 local_2d8[0]._M_local_buf[0]) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_208._M_dataplus._M_p != paVar1) {
        operator_delete(local_208._M_dataplus._M_p,
                        CONCAT71(local_208.field_2._M_allocated_capacity._1_7_,
                                 local_208.field_2._M_local_buf[0]) + 1);
      }
      pcVar5 = local_2b8;
      if (*(bool *)(local_2f0._0_8_ + 0x130) == true) {
        pcVar2 = (local_2b8->Type)._M_dataplus._M_p;
        sVar3 = (local_2b8->Type)._M_string_length;
        if (sVar3 != 0x17) {
          if ((sVar3 != 0xb) || (iVar6 = bcmp(pcVar2,"CXX_MODULES",0xb), iVar6 != 0))
          goto LAB_004f67c2;
LAB_004f68ef:
          this_00 = local_218->IEGen->LocalGenerator->Makefile;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"The \"",5);
          psVar8 = cmGeneratorTarget::GetName_abi_cxx11_(local_2b0);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             ((ostream *)local_1a8,(psVar8->_M_dataplus)._M_p,
                              psVar8->_M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"\" target\'s interface file set \"",0x1f);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(local_2b8->Name)._M_dataplus._M_p,
                              (local_2b8->Name)._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\" of type \"",0xb);
          poVar9 = std::__ostream_insert<char,std::char_traits<char>>
                             (poVar9,(pcVar5->Type)._M_dataplus._M_p,(pcVar5->Type)._M_string_length
                             );
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,
                     "\" contains context-sensitive base file entries which is not supported.",0x46)
          ;
          std::__cxx11::stringbuf::str();
          cmMakefile::IssueMessage(this_00,FATAL_ERROR,(string *)(local_2f0 + 8));
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f0._8_8_ != local_2d8) {
            operator_delete((void *)local_2f0._8_8_,
                            CONCAT71(local_2d8[0]._M_allocated_capacity._1_7_,
                                     local_2d8[0]._M_local_buf[0]) + 1);
          }
          (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)local_220;
          __return_storage_ptr__->_M_string_length = 0;
          (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
          std::ios_base::~ios_base(local_138);
          iVar6 = 1;
          goto LAB_004f68a9;
        }
        iVar6 = bcmp(pcVar2,"CXX_MODULE_HEADER_UNITS",0x17);
        if (iVar6 == 0) goto LAB_004f68ef;
LAB_004f67c2:
        if ((long)local_270.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish -
            (long)local_270.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start == 0x20) goto LAB_004f67f1;
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)(config->_M_dataplus)._M_p;
        local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)config->_M_string_length;
        local_1a8._0_8_ = (_func_int **)0xc;
        local_1a8._8_8_ = "\"$<$<CONFIG:";
        local_188 = 2;
        local_180 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)0x6ef6b5;
        local_178 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_string_length;
        local_170 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p;
        local_168 = 2;
        local_160 = ">\"";
        views_01._M_len = 5;
        views_01._M_array = (iterator)local_1a8;
        cmCatViews_abi_cxx11_((string *)(local_2f0 + 8),views_01);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                   (string *)(local_2f0 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_2f0._8_8_ != local_2d8) {
          operator_delete((void *)local_2f0._8_8_,
                          CONCAT71(local_2d8[0]._M_allocated_capacity._1_7_,
                                   local_2d8[0]._M_local_buf[0]) + 1);
        }
        iVar6 = 0;
        bVar4 = true;
      }
      else {
LAB_004f67f1:
        local_208._M_dataplus._M_p = &DAT_00000001;
        local_208.field_2._M_local_buf[0] = '\"';
        local_1a8._0_8_ = &DAT_00000001;
        local_198 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_string_length;
        local_190 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_2a8._M_dataplus._M_p;
        local_2f0._8_8_ = &DAT_00000001;
        local_2e0 = local_2d8;
        local_2d8[0]._M_local_buf[0] = '\"';
        local_188 = 1;
        views_00._M_len = 3;
        views_00._M_array = (iterator)local_1a8;
        local_208._M_string_length = (size_type)paVar1;
        local_1a8._8_8_ = paVar1;
        local_180 = local_2e0;
        cmCatViews_abi_cxx11_(&local_258,views_00);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_288,
                   &local_258);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_258._M_dataplus._M_p != &local_258.field_2) {
          operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
        }
        iVar6 = 2;
LAB_004f68a9:
        bVar4 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_2a8._M_dataplus._M_p != &local_2a8.field_2) {
        operator_delete(local_2a8._M_dataplus._M_p,local_2a8.field_2._M_allocated_capacity + 1);
      }
      if (!bVar4) goto LAB_004f6b13;
      config = config + 1;
    } while (config != local_210);
    iVar6 = 2;
LAB_004f6b13:
    if (iVar6 != 2) goto LAB_004f6b3c;
  }
  separator._M_str = " ";
  separator._M_len = 1;
  cmJoin(__return_storage_ptr__,&local_288,separator,(string_view)ZEXT816(0));
LAB_004f6b3c:
  std::
  unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>::
  ~unique_ptr((unique_ptr<cmCompiledGeneratorExpression,_std::default_delete<cmCompiledGeneratorExpression>_>
               *)local_2f0);
  cmGeneratorExpression::~cmGeneratorExpression((cmGeneratorExpression *)local_1d8);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_270);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_288);
  return __return_storage_ptr__;
}

Assistant:

std::string cmExportInstallFileGenerator::GetFileSetDirectories(
  cmGeneratorTarget* gte, cmFileSet* fileSet, cmTargetExport* te)
{
  std::vector<std::string> resultVector;

  auto configs =
    gte->Makefile->GetGeneratorConfigs(cmMakefile::IncludeEmptyConfig);

  cmGeneratorExpression ge;
  auto cge = ge.Parse(te->FileSetGenerators.at(fileSet)->GetDestination());

  for (auto const& config : configs) {
    auto dest = cmStrCat("${_IMPORT_PREFIX}/",
                         cmOutputConverter::EscapeForCMake(
                           cge->Evaluate(gte->LocalGenerator, config, gte),
                           cmOutputConverter::WrapQuotes::NoWrap));

    auto const& type = fileSet->GetType();
    // C++ modules do not support interface file sets which are dependent upon
    // the configuration.
    if (cge->GetHadContextSensitiveCondition() &&
        (type == "CXX_MODULES"_s || type == "CXX_MODULE_HEADER_UNITS"_s)) {
      auto* mf = this->IEGen->GetLocalGenerator()->GetMakefile();
      std::ostringstream e;
      e << "The \"" << gte->GetName() << "\" target's interface file set \""
        << fileSet->GetName() << "\" of type \"" << type
        << "\" contains context-sensitive base file entries which is not "
           "supported.";
      mf->IssueMessage(MessageType::FATAL_ERROR, e.str());
      return std::string{};
    }

    if (cge->GetHadContextSensitiveCondition() && configs.size() != 1) {
      resultVector.push_back(
        cmStrCat("\"$<$<CONFIG:", config, ">:", dest, ">\""));
    } else {
      resultVector.push_back(cmStrCat('"', dest, '"'));
      break;
    }
  }

  return cmJoin(resultVector, " ");
}